

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_subq_16_ai(void)

{
  uint address;
  uint uVar1;
  uint uVar2;
  uint res;
  uint dst;
  uint ea;
  uint src;
  
  uVar1 = m68ki_cpu.ir >> 9;
  address = m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8];
  uVar2 = m68ki_read_16_fc(address,m68ki_cpu.s_flag | m68ki_address_space);
  uVar1 = uVar2 - ((uVar1 - 1 & 7) + 1);
  m68ki_cpu.n_flag = uVar1 >> 8;
  m68ki_cpu.not_z_flag = uVar1 & 0xffff;
  m68ki_cpu.x_flag = uVar1 >> 8;
  m68ki_cpu.v_flag = (uVar2 & (uVar1 ^ uVar2)) >> 8;
  m68ki_cpu.c_flag = m68ki_cpu.x_flag;
  m68ki_write_16_fc(address,m68ki_cpu.s_flag | 1,m68ki_cpu.not_z_flag);
  return;
}

Assistant:

static void m68k_op_subq_16_ai(void)
{
	uint src = (((REG_IR >> 9) - 1) & 7) + 1;
	uint ea = EA_AY_AI_16();
	uint dst = m68ki_read_16(ea);
	uint res = dst - src;

	FLAG_N = NFLAG_16(res);
	FLAG_Z = MASK_OUT_ABOVE_16(res);
	FLAG_X = FLAG_C = CFLAG_16(res);
	FLAG_V = VFLAG_SUB_16(src, dst, res);

	m68ki_write_16(ea, FLAG_Z);
}